

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void stbi__vertical_flip(void *image,int w,int h,int bytes_per_pixel)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  size_t bytes_copy;
  size_t bytes_left;
  stbi_uc *row1;
  stbi_uc *row0;
  stbi_uc *bytes;
  stbi_uc temp [2048];
  size_t bytes_per_row;
  int row;
  size_t local_858;
  ulong local_848;
  void *local_840;
  void *local_838;
  undefined1 local_828 [2056];
  ulong local_20;
  int local_18;
  int local_10;
  
  local_20 = (long)in_ESI * (long)in_ECX;
  local_10 = in_EDX;
  for (local_18 = 0; local_18 < local_10 >> 1; local_18 = local_18 + 1) {
    local_838 = (void *)(in_RDI + (long)local_18 * local_20);
    local_840 = (void *)(in_RDI + (long)((local_10 - local_18) + -1) * local_20);
    for (local_848 = local_20; local_848 != 0; local_848 = local_848 - local_858) {
      if (local_848 < 0x800) {
        local_858 = local_848;
      }
      else {
        local_858 = 0x800;
      }
      memcpy(local_828,local_838,local_858);
      memcpy(local_838,local_840,local_858);
      memcpy(local_840,local_828,local_858);
      local_838 = (void *)(local_858 + (long)local_838);
      local_840 = (void *)(local_858 + (long)local_840);
    }
  }
  return;
}

Assistant:

static void stbi__vertical_flip(void *image, int w, int h, int bytes_per_pixel)
{
   int row;
   size_t bytes_per_row = (size_t)w * bytes_per_pixel;
   stbi_uc temp[2048];
   stbi_uc *bytes = (stbi_uc *)image;

   for (row = 0; row < (h>>1); row++) {
      stbi_uc *row0 = bytes + row*bytes_per_row;
      stbi_uc *row1 = bytes + (h - row - 1)*bytes_per_row;
      // swap row0 with row1
      size_t bytes_left = bytes_per_row;
      while (bytes_left) {
         size_t bytes_copy = (bytes_left < sizeof(temp)) ? bytes_left : sizeof(temp);
         memcpy(temp, row0, bytes_copy);
         memcpy(row0, row1, bytes_copy);
         memcpy(row1, temp, bytes_copy);
         row0 += bytes_copy;
         row1 += bytes_copy;
         bytes_left -= bytes_copy;
      }
   }
}